

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTPNSymBase::adjust_for_dyn(CTPNSymBase *this,tcpn_dyncomp_info *param_1)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar5;
  long *plVar4;
  
  pCVar5 = G_prs->global_symtab_;
  pcVar1 = this->sym_;
  sVar2 = this->len_;
  do {
    iVar3 = (*pCVar5->_vptr_CTcPrsSymtab[2])(pCVar5,pcVar1,sVar2);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar4 != (long *)0x0) goto LAB_00235f41;
    pCVar5 = pCVar5->parent_;
  } while (pCVar5 != (CTcPrsSymtab *)0x0);
  plVar4 = (long *)0x0;
LAB_00235f41:
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x78))(plVar4);
    return &this->super_CTcPrsNode;
  }
  CTcTokenizer::log_error(0x2b18,(ulong)(uint)this->len_,this->sym_);
  err_throw_a(0x2b18,2,0,(ulong)(uint)this->len_,2,this->sym_);
}

Assistant:

CTcPrsNode *CTPNSymBase::adjust_for_dyn(const tcpn_dyncomp_info *)
{
    /* 
     *   If this symbol isn't defined in the global symbol table, we can't
     *   evaluate this expression in the debugger - new symbols can never
     *   be defined in the debugger, so there's no point in trying to hold
     *   a forward reference as we normally would for an undefined symbol.
     *   We need look only in the global symbol table because local
     *   symbols will already have been resolved.  
     */
    if (G_prs->get_global_symtab()->find(sym_, len_) == 0)
    {
        /* log the error, to generate an appropriate message */
        G_tok->log_error(TCERR_UNDEF_SYM, (int)len_, sym_);
        
        /* throw the error as well */
        err_throw_a(TCERR_UNDEF_SYM, 2,
                    ERR_TYPE_INT, (int)len_, ERR_TYPE_TEXTCHAR, sym_);
    }
    
    /* return myself unchanged */
    return this;
}